

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O1

float If_CutAverageRefs(If_Man_t *p,If_Cut_t *pCut)

{
  void *pvVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  float fVar5;
  
  uVar2 = *(uint *)&pCut->field_0x1c >> 0x18;
  fVar5 = 0.0;
  if (0xffffff < *(uint *)&pCut->field_0x1c) {
    uVar4 = 0;
    iVar3 = 0;
    do {
      fVar5 = (&pCut[1].Area)[uVar4];
      if (((long)(int)fVar5 < 0) || (p->vObjs->nSize <= (int)fVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = p->vObjs->pArray[(int)fVar5];
      if (pvVar1 == (void *)0x0) break;
      iVar3 = iVar3 + *(int *)((long)pvVar1 + 0xc);
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
    fVar5 = (float)iVar3;
  }
  return fVar5 / (float)uVar2;
}

Assistant:

float If_CutAverageRefs( If_Man_t * p, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    int nRefsTotal, i;
    nRefsTotal = 0;
    If_CutForEachLeaf( p, pCut, pLeaf, i )
        nRefsTotal += pLeaf->nRefs;
    return ((float)nRefsTotal)/pCut->nLeaves;
}